

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertproxymodel.cpp
# Opt level: O1

void __thiscall
InsertProxyModelPrivate::onMoved
          (InsertProxyModelPrivate *this,bool isRow,QModelIndex *parent,int start,int end,
          QModelIndex *destination,int destIdx)

{
  bool bVar1;
  long from;
  
  if (((-1 < parent->r) && (-1 < parent->c)) && (parent->m != (QAbstractItemModel *)0x0)) {
    return;
  }
  if (((-1 < destination->r) && (-1 < destination->c)) &&
     (destination->m != (QAbstractItemModel *)0x0)) {
    onRemoved(this,isRow,parent,start,end);
    return;
  }
  if (start <= end) {
    from = (long)end;
    do {
      QList<QMap<int,_QVariant>_>::move(this->m_extraData + !isRow,from,(long)destIdx);
      bVar1 = start < from;
      from = from + -1;
    } while (bVar1);
  }
  if (isRow) {
    QAbstractItemModel::endMoveRows();
    return;
  }
  QAbstractItemModel::endMoveColumns();
  return;
}

Assistant:

void InsertProxyModelPrivate::onMoved(bool isRow, const QModelIndex &parent, int start, int end, const QModelIndex &destination, int destIdx)
{
    if (parent.isValid())
        return;
    if (destination.isValid())
        return onRemoved(isRow, parent, start, end);
    for (; start <= end; --end)
        m_extraData[!isRow].move(end, destIdx);
    Q_Q(InsertProxyModel);
    isRow ? q->endMoveRows() : q->endMoveColumns();
}